

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O3

void inlet_list(_inlet *x,t_symbol *s,int argc,t_atom *argv)

{
  t_pd *x_00;
  char *pcVar1;
  t_symbol *ptVar2;
  t_gotfn p_Var3;
  t_float f;
  
  ptVar2 = x->i_symfrom;
  if ((((ptVar2 == &s_pointer) || (ptVar2 == &s_symbol)) || (ptVar2 == &s_list)) ||
     (ptVar2 == &s_float)) {
    pd_typedmess(x->i_dest,(x->i_un).iu_symto,argc,argv);
    return;
  }
  if (ptVar2 == (t_symbol *)0x0) {
    pd_list(x->i_dest,s,argc,argv);
    return;
  }
  if (argc == 1) {
    if (argv->a_type == A_SYMBOL) {
      ptVar2 = atom_getsymbol(argv);
      inlet_symbol(x,ptVar2);
      return;
    }
    if (argv->a_type == A_FLOAT) {
      f = atom_getfloat(argv);
      inlet_float(x,f);
      return;
    }
  }
  else if (argc == 0) {
    inlet_bang(x);
    return;
  }
  if (ptVar2 == &s_signal) {
    x_00 = x->i_dest;
    ptVar2 = gensym("fwd");
    p_Var3 = zgetfn(x_00,ptVar2);
    if (p_Var3 != (t_gotfn)0x0) {
      inlet_fwd(x,&s_list,argc,argv);
      return;
    }
  }
  pcVar1 = class_getname(*x->i_dest);
  post("class %s",pcVar1);
  pd_error(x->i_owner,"inlet: expected \'%s\' but got \'%s\'",x->i_symfrom->s_name,s_list.s_name);
  return;
}

Assistant:

static void inlet_list(t_inlet *x, t_symbol *s, int argc, t_atom *argv)
{
    t_atom at;
    if (x->i_symfrom == &s_list || x->i_symfrom == &s_float
        || x->i_symfrom == &s_symbol || x->i_symfrom == &s_pointer)
            typedmess(x->i_dest, x->i_symto, argc, argv);
    else if (!x->i_symfrom) pd_list(x->i_dest, s, argc, argv);
    else if (!argc)
      inlet_bang(x);
    else if (argc==1 && argv->a_type == A_FLOAT)
      inlet_float(x, atom_getfloat(argv));
    else if (argc==1 && argv->a_type == A_SYMBOL)
      inlet_symbol(x, atom_getsymbol(argv));
    else if (x->i_symfrom == &s_signal && zgetfn(x->i_dest, gensym("fwd")))
        inlet_fwd(x, &s_list, argc, argv);
    else post("class %s", class_getname(*x->i_dest)), inlet_wrong(x, &s_list);
}